

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::BufferTestUtil::BufferCase::BufferCase
          (BufferCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description)

{
  int iVar1;
  undefined4 extraout_var;
  TestLog *log;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  BufferCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog(testCtx);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_015cb638;
  this->m_renderCtx = renderCtx;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedBuffers);
  return;
}

Assistant:

BufferCase::BufferCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description)
	: TestCase			(testCtx, name, description)
	, CallLogWrapper	(renderCtx.getFunctions(), testCtx.getLog())
	, m_renderCtx		(renderCtx)
{
}